

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_convolve_avx2.c
# Opt level: O2

void av1_highbd_convolve_y_sr_avx2
               (uint16_t *src,int src_stride,uint16_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_y,int subpel_y_qn,int bd)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined2 uVar6;
  undefined2 uVar7;
  long lVar8;
  long lVar9;
  uint16_t *puVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  undefined1 (*pauVar15) [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 in_ZMM12 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  __m256i coeffs_y [4];
  __m256i local_e0;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  if (filter_params_y->taps == 0xc) {
    av1_highbd_convolve_y_sr_ssse3(src,src_stride,dst,dst_stride,w,h,filter_params_y,subpel_y_qn,bd)
    ;
  }
  else {
    lVar14 = (long)(int)(((filter_params_y->taps >> 1) - 1) * src_stride);
    uVar6 = 0xff;
    if (bd == 0xc) {
      uVar6 = 0xfff;
    }
    uVar7 = 0x3ff;
    if (bd != 10) {
      uVar7 = uVar6;
    }
    auVar23 = ZEXT1664(in_ZMM12._0_16_);
    prepare_coeffs(filter_params_y,subpel_y_qn,&local_e0);
    lVar13 = (long)dst_stride;
    lVar12 = (long)(src_stride * 8) * 2 + lVar14 * -2;
    lVar11 = (long)(src_stride * 7) * 2 + lVar14 * -2;
    for (lVar8 = 0; lVar8 < w; lVar8 = lVar8 + 8) {
      pauVar15 = (undefined1 (*) [16])(src + (lVar8 - lVar14));
      auVar1 = *(undefined1 (*) [16])(*pauVar15 + (long)src_stride * 2);
      auVar21._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * *pauVar15;
      auVar21._16_16_ = ZEXT116(1) * auVar1;
      auVar2 = *(undefined1 (*) [16])(*pauVar15 + (long)(src_stride * 2) * 2);
      auVar22._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar1;
      auVar22._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
      auVar1 = *(undefined1 (*) [16])(*pauVar15 + (long)(src_stride * 3) * 2);
      auVar18._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
      auVar18._16_16_ = ZEXT116(1) * auVar1;
      auVar2 = *(undefined1 (*) [16])(*pauVar15 + (long)(src_stride * 4) * 2);
      auVar19._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar1;
      auVar19._16_16_ = ZEXT116(1) * auVar2;
      auVar1 = *(undefined1 (*) [16])(*pauVar15 + (long)(src_stride * 5) * 2);
      auVar28._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
      auVar28._16_16_ = ZEXT116(1) * auVar1;
      auVar2 = *(undefined1 (*) [16])(*pauVar15 + (long)(src_stride * 6) * 2);
      auVar16 = local_e0._0_16_;
      auVar24._0_16_ = ZEXT116(0) * auVar16 + ZEXT116(1) * auVar2;
      auVar24._32_32_ = auVar23._32_32_;
      auVar24._16_16_ = ZEXT116(1) * auVar16;
      auVar17._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar1;
      auVar17._16_16_ = ZEXT116(1) * auVar2;
      auVar25 = vpunpcklwd_avx2(auVar21,auVar22);
      auVar3 = vpunpcklwd_avx2(auVar18,auVar19);
      auVar4 = vpunpcklwd_avx2(auVar28,auVar17);
      auVar22 = vpunpckhwd_avx2(auVar21,auVar22);
      auVar18 = vpunpckhwd_avx2(auVar18,auVar19);
      auVar17 = vpunpckhwd_avx2(auVar28,auVar17);
      puVar10 = src;
      pauVar15 = (undefined1 (*) [16])dst;
      for (lVar9 = 0; auVar19 = auVar17, lVar9 < h; lVar9 = lVar9 + 2) {
        auVar1 = *(undefined1 (*) [16])((long)puVar10 + lVar11);
        auVar20._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar24._0_16_;
        auVar20._16_16_ = ZEXT116(0) * auVar24._16_16_ + ZEXT116(1) * auVar1;
        auVar2 = *(undefined1 (*) [16])((long)puVar10 + lVar12);
        auVar26._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar1;
        auVar26._16_16_ = ZEXT116(1) * auVar2;
        auVar28 = vpunpcklwd_avx2(auVar20,auVar26);
        auVar17 = vpunpckhwd_avx2(auVar20,auVar26);
        auVar25 = vpmaddwd_avx2(auVar25,(undefined1  [32])local_e0);
        auVar21 = vpmaddwd_avx2(auVar3,local_c0);
        auVar25 = vpaddd_avx2(auVar25,auVar21);
        auVar21 = vpmaddwd_avx2(auVar4,local_a0);
        auVar25 = vpaddd_avx2(auVar25,auVar21);
        auVar21 = vpmaddwd_avx2(auVar28,local_80);
        auVar27._8_4_ = 0x40;
        auVar27._0_8_ = 0x4000000040;
        auVar27._12_4_ = 0x40;
        auVar27._16_4_ = 0x40;
        auVar27._20_4_ = 0x40;
        auVar27._24_4_ = 0x40;
        auVar27._28_4_ = 0x40;
        auVar25 = vpaddd_avx2(auVar25,auVar27);
        auVar25 = vpaddd_avx2(auVar25,auVar21);
        auVar25 = vpsrad_avx2(auVar25,7);
        if (lVar8 < (long)w + -4) {
          auVar22 = vpmaddwd_avx2(auVar22,(undefined1  [32])local_e0);
          auVar21 = vpmaddwd_avx2(auVar18,local_c0);
          auVar22 = vpaddd_avx2(auVar22,auVar21);
          auVar21 = vpmaddwd_avx2(auVar19,local_a0);
          auVar22 = vpaddd_avx2(auVar22,auVar21);
          auVar21 = vpmaddwd_avx2(auVar17,local_80);
          auVar22 = vpaddd_avx2(auVar22,auVar27);
          auVar22 = vpaddd_avx2(auVar22,auVar21);
          auVar22 = vpsrad_avx2(auVar22,7);
          auVar22 = vpackssdw_avx2(auVar25,auVar22);
          auVar5._2_2_ = uVar7;
          auVar5._0_2_ = uVar7;
          auVar5._4_2_ = uVar7;
          auVar5._6_2_ = uVar7;
          auVar5._8_2_ = uVar7;
          auVar5._10_2_ = uVar7;
          auVar5._12_2_ = uVar7;
          auVar5._14_2_ = uVar7;
          auVar5._16_2_ = uVar7;
          auVar5._18_2_ = uVar7;
          auVar5._20_2_ = uVar7;
          auVar5._22_2_ = uVar7;
          auVar5._24_2_ = uVar7;
          auVar5._26_2_ = uVar7;
          auVar5._28_2_ = uVar7;
          auVar5._30_2_ = uVar7;
          auVar22 = vpminsw_avx2(auVar22,auVar5);
          auVar22 = vpmaxsw_avx2(auVar22,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
          *pauVar15 = auVar22._0_16_;
          *(undefined1 (*) [16])((long)*pauVar15 + lVar13 * 2) = auVar22._16_16_;
        }
        else {
          auVar22 = vpackssdw_avx2(auVar25,auVar25);
          auVar25._2_2_ = uVar7;
          auVar25._0_2_ = uVar7;
          auVar25._4_2_ = uVar7;
          auVar25._6_2_ = uVar7;
          auVar25._8_2_ = uVar7;
          auVar25._10_2_ = uVar7;
          auVar25._12_2_ = uVar7;
          auVar25._14_2_ = uVar7;
          auVar25._16_2_ = uVar7;
          auVar25._18_2_ = uVar7;
          auVar25._20_2_ = uVar7;
          auVar25._22_2_ = uVar7;
          auVar25._24_2_ = uVar7;
          auVar25._26_2_ = uVar7;
          auVar25._28_2_ = uVar7;
          auVar25._30_2_ = uVar7;
          auVar22 = vpminsw_avx2(auVar22,auVar25);
          auVar22 = vpmaxsw_avx2(auVar22,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
          if (w == 4) {
            *(long *)*pauVar15 = auVar22._0_8_;
            *(long *)((long)*pauVar15 + lVar13 * 2) = auVar22._16_8_;
          }
          else {
            *(int *)*pauVar15 = auVar22._0_4_;
            *(int *)((long)*pauVar15 + lVar13 * 2) = auVar22._16_4_;
          }
        }
        auVar24 = ZEXT3264(CONCAT1616(ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                                      ZEXT116(1) * auVar16,
                                      ZEXT116(0) * auVar16 + ZEXT116(1) * auVar2));
        puVar10 = puVar10 + (long)src_stride * 2;
        pauVar15 = (undefined1 (*) [16])((long)*pauVar15 + lVar13 * 2 * 2);
        auVar22 = auVar18;
        auVar25 = auVar3;
        auVar18 = auVar19;
        auVar3 = auVar4;
        auVar4 = auVar28;
      }
      lVar12 = lVar12 + 0x10;
      lVar11 = lVar11 + 0x10;
      dst = (uint16_t *)((long)dst + 0x10);
      auVar23 = auVar24;
    }
  }
  return;
}

Assistant:

void av1_highbd_convolve_y_sr_avx2(const uint16_t *src, int src_stride,
                                   uint16_t *dst, int dst_stride, int w, int h,
                                   const InterpFilterParams *filter_params_y,
                                   const int subpel_y_qn, int bd) {
  if (filter_params_y->taps == 12) {
    av1_highbd_convolve_y_sr_ssse3(src, src_stride, dst, dst_stride, w, h,
                                   filter_params_y, subpel_y_qn, bd);
    return;
  }
  int i, j;
  const int fo_vert = filter_params_y->taps / 2 - 1;
  const uint16_t *const src_ptr = src - fo_vert * src_stride;

  __m256i s[8], coeffs_y[4];

  const int bits = FILTER_BITS;

  const __m128i round_shift_bits = _mm_cvtsi32_si128(bits);
  const __m256i round_const_bits = _mm256_set1_epi32((1 << bits) >> 1);
  const __m256i clip_pixel =
      _mm256_set1_epi16(bd == 10 ? 1023 : (bd == 12 ? 4095 : 255));
  const __m256i zero = _mm256_setzero_si256();

  prepare_coeffs(filter_params_y, subpel_y_qn, coeffs_y);

  for (j = 0; j < w; j += 8) {
    const uint16_t *data = &src_ptr[j];
    /* Vertical filter */
    {
      __m256i src6;
      __m256i s01 = _mm256_permute2x128_si256(
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 0 * src_stride))),
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 1 * src_stride))),
          0x20);
      __m256i s12 = _mm256_permute2x128_si256(
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 1 * src_stride))),
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 2 * src_stride))),
          0x20);
      __m256i s23 = _mm256_permute2x128_si256(
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 2 * src_stride))),
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 3 * src_stride))),
          0x20);
      __m256i s34 = _mm256_permute2x128_si256(
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 3 * src_stride))),
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 4 * src_stride))),
          0x20);
      __m256i s45 = _mm256_permute2x128_si256(
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 4 * src_stride))),
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 5 * src_stride))),
          0x20);
      src6 = _mm256_castsi128_si256(
          _mm_loadu_si128((__m128i *)(data + 6 * src_stride)));
      __m256i s56 = _mm256_permute2x128_si256(
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 5 * src_stride))),
          src6, 0x20);

      s[0] = _mm256_unpacklo_epi16(s01, s12);
      s[1] = _mm256_unpacklo_epi16(s23, s34);
      s[2] = _mm256_unpacklo_epi16(s45, s56);

      s[4] = _mm256_unpackhi_epi16(s01, s12);
      s[5] = _mm256_unpackhi_epi16(s23, s34);
      s[6] = _mm256_unpackhi_epi16(s45, s56);

      for (i = 0; i < h; i += 2) {
        data = &src_ptr[i * src_stride + j];

        const __m256i s67 = _mm256_permute2x128_si256(
            src6,
            _mm256_castsi128_si256(
                _mm_loadu_si128((__m128i *)(data + 7 * src_stride))),
            0x20);

        src6 = _mm256_castsi128_si256(
            _mm_loadu_si128((__m128i *)(data + 8 * src_stride)));

        const __m256i s78 = _mm256_permute2x128_si256(
            _mm256_castsi128_si256(
                _mm_loadu_si128((__m128i *)(data + 7 * src_stride))),
            src6, 0x20);

        s[3] = _mm256_unpacklo_epi16(s67, s78);
        s[7] = _mm256_unpackhi_epi16(s67, s78);

        const __m256i res_a = convolve(s, coeffs_y);

        __m256i res_a_round = _mm256_sra_epi32(
            _mm256_add_epi32(res_a, round_const_bits), round_shift_bits);

        if (w - j > 4) {
          const __m256i res_b = convolve(s + 4, coeffs_y);
          __m256i res_b_round = _mm256_sra_epi32(
              _mm256_add_epi32(res_b, round_const_bits), round_shift_bits);

          __m256i res_16bit = _mm256_packs_epi32(res_a_round, res_b_round);
          res_16bit = _mm256_min_epi16(res_16bit, clip_pixel);
          res_16bit = _mm256_max_epi16(res_16bit, zero);

          _mm_storeu_si128((__m128i *)&dst[i * dst_stride + j],
                           _mm256_castsi256_si128(res_16bit));
          _mm_storeu_si128((__m128i *)&dst[i * dst_stride + j + dst_stride],
                           _mm256_extracti128_si256(res_16bit, 1));
        } else if (w == 4) {
          res_a_round = _mm256_packs_epi32(res_a_round, res_a_round);
          res_a_round = _mm256_min_epi16(res_a_round, clip_pixel);
          res_a_round = _mm256_max_epi16(res_a_round, zero);

          _mm_storel_epi64((__m128i *)&dst[i * dst_stride + j],
                           _mm256_castsi256_si128(res_a_round));
          _mm_storel_epi64((__m128i *)&dst[i * dst_stride + j + dst_stride],
                           _mm256_extracti128_si256(res_a_round, 1));
        } else {
          res_a_round = _mm256_packs_epi32(res_a_round, res_a_round);
          res_a_round = _mm256_min_epi16(res_a_round, clip_pixel);
          res_a_round = _mm256_max_epi16(res_a_round, zero);

          xx_storel_32(&dst[i * dst_stride + j],
                       _mm256_castsi256_si128(res_a_round));
          xx_storel_32(&dst[i * dst_stride + j + dst_stride],
                       _mm256_extracti128_si256(res_a_round, 1));
        }

        s[0] = s[1];
        s[1] = s[2];
        s[2] = s[3];

        s[4] = s[5];
        s[5] = s[6];
        s[6] = s[7];
      }
    }
  }
}